

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroIO.cpp
# Opt level: O0

void __thiscall OpenMD::HydroIO::closeWriter(HydroIO *this,ostream *os)

{
  CrtAllocator *pCVar1;
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *in_RDI;
  SizeType in_stack_ffffffffffffffdc;
  
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(in_RDI,in_stack_ffffffffffffffdc);
  rapidjson::
  PrettyWriter<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndObject(in_RDI,in_stack_ffffffffffffffdc);
  pCVar1 = (in_RDI->
           super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
           ).level_stack_.allocator_;
  if (pCVar1 != (CrtAllocator *)0x0) {
    operator_delete(pCVar1,8);
  }
  *(undefined1 *)
   &in_RDI[2].
    super_Writer<rapidjson::BasicOStreamWrapper<std::basic_ostream<char,_std::char_traits<char>_>_>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    .level_stack_.stackEnd_ = 0;
  return;
}

Assistant:

void HydroIO::closeWriter(std::ostream& os) {
#if defined(NLOHMANN_JSON)
    os << j_.dump(2) << std::endl;
#elif defined(RAPID_JSON)
    w_.EndArray();
    w_.EndObject();
    delete osw_;
#endif
    writerOpen_ = false;
  }